

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O3

void __thiscall cfd::core::DescriptorNode::AnalyzeScriptTree(DescriptorNode *this)

{
  byte bVar1;
  pointer pcVar2;
  CfdException *this_00;
  ulong uVar3;
  uint32_t script_depth;
  string tapscript;
  string temp_name;
  string desc;
  DescriptorNode node;
  uint local_23c;
  undefined1 local_238 [32];
  string local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  vector<cfd::core::DescriptorNode,std::allocator<cfd::core::DescriptorNode>> *local_1d8;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>>>
  *local_1d0;
  undefined1 *local_1c8;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *local_1c0;
  undefined1 *local_1b8;
  ulong local_1b0;
  undefined1 local_1a8 [16];
  undefined1 local_198 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178 [7];
  uint32_t local_80;
  DescriptorNodeType local_78;
  undefined1 local_50 [8];
  char *local_48;
  
  local_1b8 = local_1a8;
  pcVar2 = (this->value_)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,pcVar2,pcVar2 + (this->value_)._M_string_length);
  local_23c = 0;
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  local_218._M_string_length = 0;
  local_218.field_2._M_local_buf[0] = '\0';
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  local_1f8._M_string_length = 0;
  local_1f8.field_2._M_local_buf[0] = '\0';
  if (local_1b0 != 0) {
    local_1c0 = &this->addr_prefixes_;
    local_1c8 = local_50;
    local_1d0 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>>>
                 *)&this->tree_node_;
    local_1d8 = (vector<cfd::core::DescriptorNode,std::allocator<cfd::core::DescriptorNode>> *)
                &this->child_node_;
    uVar3 = 0;
    do {
      bVar1 = local_1b8[uVar3];
      if (bVar1 < 0x2c) {
        if (bVar1 != 0x20) {
          if (bVar1 == 0x28) {
            if (local_23c == 0) {
              ::std::__cxx11::string::substr((ulong)local_198,(ulong)&local_1b8);
              ::std::__cxx11::string::operator=((string *)&local_1f8,(string *)local_198);
              if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
                operator_delete((void *)local_198._0_8_);
              }
            }
            local_198._0_8_ = "cfdcore_descriptor.cpp";
            local_198._8_4_ = 0x609;
            local_198._16_8_ = "AnalyzeScriptTree";
            logger::log<unsigned_int&,std::__cxx11::string&>
                      ((CfdSourceLocation *)local_198,kCfdLogLevelInfo,
                       "Target`(` script_depth={}, name={}",&local_23c,&local_1f8);
            local_23c = local_23c + 1;
          }
          else if (bVar1 == 0x29) {
            local_23c = local_23c - 1;
            local_198._0_8_ = "cfdcore_descriptor.cpp";
            local_198._8_4_ = 0x60e;
            local_198._16_8_ = "AnalyzeScriptTree";
            logger::log<unsigned_int&>
                      ((CfdSourceLocation *)local_198,kCfdLogLevelInfo,"Target`)` script_depth = {}"
                       ,&local_23c);
            if (local_23c == 0) {
              ::std::__cxx11::string::substr((ulong)local_198,(ulong)&local_1b8);
              ::std::__cxx11::string::operator=((string *)&local_218,(string *)local_198);
              if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
                operator_delete((void *)local_198._0_8_);
              }
              DescriptorNode((DescriptorNode *)local_198,local_1c0);
              ::std::__cxx11::string::_M_assign((string *)local_198);
              local_78 = kDescriptorTypeScript;
              ::std::__cxx11::string::_M_assign((string *)local_178);
              local_80 = 1;
              ::std::__cxx11::string::_M_replace((ulong)local_1c8,0,local_48,0x219460);
              if ((char *)local_1f8._M_string_length != (char *)0x0) {
                AnalyzeChild((DescriptorNode *)local_198,&local_218,2);
              }
              local_238._0_8_ = local_238 + 0x10;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"tr","");
              AnalyzeAll((DescriptorNode *)local_198,(string *)local_238);
              if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
                operator_delete((void *)local_238._0_8_);
              }
              ::std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>>>
              ::_M_emplace_unique<std::__cxx11::string&,cfd::core::DescriptorNode&>
                        (local_1d0,&local_218,(DescriptorNode *)local_198);
              ::std::vector<cfd::core::DescriptorNode,std::allocator<cfd::core::DescriptorNode>>::
              emplace_back<cfd::core::DescriptorNode&>(local_1d8,(DescriptorNode *)local_198);
              ::std::__cxx11::string::_M_replace
                        ((ulong)&local_218,0,(char *)local_218._M_string_length,0x219949);
              ::std::__cxx11::string::_M_replace
                        ((ulong)&local_1f8,0,(char *)local_1f8._M_string_length,0x219949);
              local_238._0_8_ = "cfdcore_descriptor.cpp";
              local_238._8_4_ = 0x622;
              local_238._16_8_ = "AnalyzeScriptTree";
              logger::log<unsigned_int&,std::__cxx11::string&>
                        ((CfdSourceLocation *)local_238,kCfdLogLevelInfo,
                         "Target`)` script_depth={}, child.value={}",&local_23c,local_178);
              ~DescriptorNode((DescriptorNode *)local_198);
            }
          }
        }
      }
      else if (((bVar1 == 0x2c) || (bVar1 == 0x7d)) && (local_23c == 0)) {
        ::std::__cxx11::string::substr((ulong)local_198,(ulong)&local_1b8);
        ::std::__cxx11::string::operator=((string *)&local_218,(string *)local_198);
        if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
          operator_delete((void *)local_198._0_8_);
        }
        if ((char *)0x3f < local_218._M_string_length) {
          DescriptorNode((DescriptorNode *)local_198,local_1c0);
          ::std::__cxx11::string::_M_assign((string *)local_198);
          local_78 = kDescriptorTypeKey;
          ::std::__cxx11::string::_M_assign((string *)local_178);
          local_80 = 1;
          ::std::__cxx11::string::_M_replace((ulong)local_1c8,0,local_48,0x219460);
          if ((char *)local_1f8._M_string_length != (char *)0x0) {
            AnalyzeChild((DescriptorNode *)local_198,&local_218,2);
          }
          local_238._0_8_ = local_238 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"tr","");
          AnalyzeAll((DescriptorNode *)local_198,(string *)local_238);
          if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
            operator_delete((void *)local_238._0_8_);
          }
          ::std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>>>
          ::_M_emplace_unique<std::__cxx11::string&,cfd::core::DescriptorNode&>
                    (local_1d0,&local_218,(DescriptorNode *)local_198);
          ::std::vector<cfd::core::DescriptorNode,std::allocator<cfd::core::DescriptorNode>>::
          emplace_back<cfd::core::DescriptorNode&>(local_1d8,(DescriptorNode *)local_198);
          ::std::__cxx11::string::_M_replace
                    ((ulong)&local_218,0,(char *)local_218._M_string_length,0x219949);
          ::std::__cxx11::string::_M_replace
                    ((ulong)&local_1f8,0,(char *)local_1f8._M_string_length,0x219949);
          local_238._0_8_ = "cfdcore_descriptor.cpp";
          local_238._8_4_ = 0x5fd;
          local_238._16_8_ = "AnalyzeScriptTree";
          logger::log<unsigned_int&,std::__cxx11::string&>
                    ((CfdSourceLocation *)local_238,kCfdLogLevelInfo,
                     "HashTarget script_depth={}, child.value={}",&local_23c,local_178);
          ~DescriptorNode((DescriptorNode *)local_198);
        }
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < local_1b0);
  }
  if ((this->tree_node_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    if ((this->value_)._M_string_length < 0x40) {
      local_198._0_8_ = "cfdcore_descriptor.cpp";
      local_198._8_4_ = 0x63d;
      local_198._16_8_ = "AnalyzeScriptTree";
      logger::log<>((CfdSourceLocation *)local_198,kCfdLogLevelWarning,
                    "Failed to taproot. empty script.");
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      local_198._0_8_ = local_198 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_198,"Failed to taproot. empty script.","");
      CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_198);
      __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ::std::__cxx11::string::_M_assign((string *)&local_218);
    DescriptorNode((DescriptorNode *)local_198,&this->addr_prefixes_);
    ::std::__cxx11::string::_M_assign((string *)local_198);
    local_78 = kDescriptorTypeKey;
    ::std::__cxx11::string::_M_assign((string *)local_178);
    local_80 = 1;
    ::std::__cxx11::string::_M_replace((ulong)local_50,0,local_48,0x219460);
    if ((char *)local_1f8._M_string_length != (char *)0x0) {
      AnalyzeChild((DescriptorNode *)local_198,&local_218,2);
    }
    local_238._0_8_ = local_238 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"tr","");
    AnalyzeAll((DescriptorNode *)local_198,(string *)local_238);
    if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
      operator_delete((void *)local_238._0_8_);
    }
    ::std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>>>
    ::_M_emplace_unique<std::__cxx11::string&,cfd::core::DescriptorNode&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>>>
                *)&this->tree_node_,&local_218,(DescriptorNode *)local_198);
    ::std::vector<cfd::core::DescriptorNode,std::allocator<cfd::core::DescriptorNode>>::
    emplace_back<cfd::core::DescriptorNode&>
              ((vector<cfd::core::DescriptorNode,std::allocator<cfd::core::DescriptorNode>> *)
               &this->child_node_,(DescriptorNode *)local_198);
    ::std::__cxx11::string::_M_replace
              ((ulong)&local_218,0,(char *)local_218._M_string_length,0x219949);
    ::std::__cxx11::string::_M_replace
              ((ulong)&local_1f8,0,(char *)local_1f8._M_string_length,0x219949);
    local_238._0_8_ = "cfdcore_descriptor.cpp";
    local_238._8_4_ = 0x63a;
    local_238._16_8_ = "AnalyzeScriptTree";
    logger::log<unsigned_int&,std::__cxx11::string&>
              ((CfdSourceLocation *)local_238,kCfdLogLevelInfo,
               "LastTarget script_depth={}, child.value={}",&local_23c,local_178);
    ~DescriptorNode((DescriptorNode *)local_198);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p);
  }
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8);
  }
  return;
}

Assistant:

void DescriptorNode::AnalyzeScriptTree() {
  auto desc = value_;

  uint32_t script_depth = 0;
  size_t offset = 0;
  std::string tapscript;
  uint32_t tapleaf_count = 0;
  std::string temp_name;
  for (size_t idx = 0; idx < desc.size(); ++idx) {
    const char& str = desc[idx];
    if ((str == ' ') || (str == '{')) {
      if (script_depth == 0) ++offset;
    } else if ((str == ',') || (str == '}')) {
      if (script_depth == 0) {
        tapscript = desc.substr(offset, idx - offset);
        if (tapscript.length() >= (kByteData256Length * 2)) {
          offset = idx + 1;
          DescriptorNode node(addr_prefixes_);
          node.name_ = temp_name;
          node.node_type_ = DescriptorNodeType::kDescriptorTypeKey;
          node.value_ = tapscript;
          node.depth_ = 1;
          node.parent_kind_ = "tr";
          if (!temp_name.empty()) {
            node.AnalyzeChild(tapscript, 2);
          }
          node.AnalyzeAll("tr");
          tree_node_.emplace(tapscript, node);
          child_node_.emplace_back(node);
          ++tapleaf_count;
          tapscript = "";
          temp_name = "";
          info(
              CFD_LOG_SOURCE, "HashTarget script_depth={}, child.value={}",
              script_depth, node.value_);
        } else {
          ++offset;
        }
      }
    } else if (str == '(') {
      if (script_depth == 0) {
        temp_name = desc.substr(offset, idx - offset);
        // offset = idx + 1;
      }
      info(
          CFD_LOG_SOURCE, "Target`(` script_depth={}, name={}", script_depth,
          temp_name);
      ++script_depth;
    } else if (str == ')') {
      --script_depth;
      info(CFD_LOG_SOURCE, "Target`)` script_depth = {}", script_depth);
      if (script_depth == 0) {
        tapscript = desc.substr(offset, idx - offset + 1);
        offset = idx + 1;
        DescriptorNode node(addr_prefixes_);
        node.name_ = temp_name;
        node.node_type_ = DescriptorNodeType::kDescriptorTypeScript;
        node.value_ = tapscript;
        node.depth_ = 1;
        node.parent_kind_ = "tr";
        if (!temp_name.empty()) {
          node.AnalyzeChild(tapscript, 2);
        }
        node.AnalyzeAll("tr");
        tree_node_.emplace(tapscript, node);
        child_node_.emplace_back(node);
        ++tapleaf_count;
        tapscript = "";
        temp_name = "";
        info(
            CFD_LOG_SOURCE, "Target`)` script_depth={}, child.value={}",
            script_depth, node.value_);
      }
    }
  }
  if (tree_node_.empty()) {
    if (value_.length() >= (kByteData256Length * 2)) {
      tapscript = value_;
      DescriptorNode node(addr_prefixes_);
      node.name_ = temp_name;
      node.node_type_ = DescriptorNodeType::kDescriptorTypeKey;
      node.value_ = tapscript;
      node.depth_ = 1;
      node.parent_kind_ = "tr";
      if (!temp_name.empty()) {
        node.AnalyzeChild(tapscript, 2);
      }
      node.AnalyzeAll("tr");
      tree_node_.emplace(tapscript, node);
      child_node_.emplace_back(node);
      ++tapleaf_count;
      tapscript = "";
      temp_name = "";
      info(
          CFD_LOG_SOURCE, "LastTarget script_depth={}, child.value={}",
          script_depth, node.value_);
    } else {
      warn(CFD_LOG_SOURCE, "Failed to taproot. empty script.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to taproot. empty script.");
    }
  }
}